

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

int mp_check(char **data,char *end)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t len;
  int l;
  uint8_t c;
  int64_t k;
  char *end_local;
  char **data_local;
  
  _l = 1;
  do {
    if (_l < 1) {
      if (*data <= end) {
        return 0;
      }
      __assert_fail("*data <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                    ,0xa2b,"int mp_check(const char **, const char *)");
    }
    if (end == *data) {
      return 1;
    }
    bVar1 = mp_load_u8(data);
    iVar3 = (int)""[bVar1];
    if (iVar3 < 0) {
      if (iVar3 < -0x1f) {
        switch(iVar3) {
        case -0x29:
          if ((ulong)((long)end - (long)*data) < 5) {
            return 1;
          }
          uVar4 = mp_load_u32(data);
          mp_load_u8(data);
          if ((ulong)((long)end - (long)*data) < (ulong)uVar4) {
            return 1;
          }
          *data = *data + uVar4;
          break;
        case -0x28:
          if ((ulong)((long)end - (long)*data) < 3) {
            return 1;
          }
          uVar2 = mp_load_u16(data);
          mp_load_u8(data);
          if ((ulong)((long)end - (long)*data) < (ulong)(uint)uVar2) {
            return 1;
          }
          *data = *data + (uint)uVar2;
          break;
        case -0x27:
          if ((ulong)((long)end - (long)*data) < 2) {
            return 1;
          }
          bVar1 = mp_load_u8(data);
          mp_load_u8(data);
          if ((ulong)((long)end - (long)*data) < (ulong)(uint)bVar1) {
            return 1;
          }
          *data = *data + (uint)bVar1;
          break;
        case -0x26:
          if ((ulong)((long)end - (long)*data) < 4) {
            return 1;
          }
          uVar4 = mp_load_u32(data);
          _l = (ulong)(uVar4 << 1) + _l;
          break;
        case -0x25:
          if ((ulong)((long)end - (long)*data) < 2) {
            return 1;
          }
          uVar2 = mp_load_u16(data);
          _l = (int)((uint)uVar2 << 1) + _l;
          break;
        case -0x24:
          if ((ulong)((long)end - (long)*data) < 4) {
            return 1;
          }
          uVar4 = mp_load_u32(data);
          _l = (ulong)uVar4 + _l;
          break;
        case -0x23:
          if ((ulong)((long)end - (long)*data) < 2) {
            return 1;
          }
          uVar2 = mp_load_u16(data);
          _l = (ulong)uVar2 + _l;
          break;
        case -0x22:
          if ((ulong)((long)end - (long)*data) < 4) {
            return 1;
          }
          uVar4 = mp_load_u32(data);
          if ((ulong)((long)end - (long)*data) < (ulong)uVar4) {
            return 1;
          }
          *data = *data + uVar4;
          break;
        case -0x21:
          if ((ulong)((long)end - (long)*data) < 2) {
            return 1;
          }
          uVar2 = mp_load_u16(data);
          if ((ulong)((long)end - (long)*data) < (ulong)(uint)uVar2) {
            return 1;
          }
          *data = *data + (uint)uVar2;
          break;
        case -0x20:
          if (end == *data) {
            return 1;
          }
          bVar1 = mp_load_u8(data);
          if ((ulong)((long)end - (long)*data) < (ulong)(uint)bVar1) {
            return 1;
          }
          *data = *data + (uint)bVar1;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                        ,0xa27,"int mp_check(const char **, const char *)");
        }
      }
      else {
        _l = _l - iVar3;
      }
    }
    else {
      if ((ulong)((long)end - (long)*data) < (ulong)(long)iVar3) {
        return 1;
      }
      *data = *data + iVar3;
    }
    _l = _l + -1;
  } while( true );
}

Assistant:

MP_IMPL int
mp_check(const char **data, const char *end)
{
#define MP_CHECK_LEN(_l) \
	if (mp_unlikely((size_t)(end - *data) < (size_t)(_l))) \
		return 1;

	int64_t k;
	for (k = 1; k > 0; k--) {
		MP_CHECK_LEN(1);
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		if (mp_likely(l >= 0)) {
			MP_CHECK_LEN(l);
			*data += l;
			continue;
		} else if (mp_likely(l > MP_HINT)) {
			k -= l;
			continue;
		}

		uint32_t len;
		switch (l) {
		case MP_HINT_STR_8:
			/* MP_STR (8) */
			MP_CHECK_LEN(sizeof(uint8_t));
			len = mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_16:
			/* MP_STR (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			len = mp_load_u16(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_32:
			/* MP_STR (32) */
			MP_CHECK_LEN(sizeof(uint32_t))
			len = mp_load_u32(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_ARRAY_16:
			/* MP_ARRAY (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += mp_load_u16(data);
			break;
		case MP_HINT_ARRAY_32:
			/* MP_ARRAY (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += mp_load_u32(data);
			break;
		case MP_HINT_MAP_16:
			/* MP_MAP (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += 2 * mp_load_u16(data);
			break;
		case MP_HINT_MAP_32:
			/* MP_MAP (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += 2 * mp_load_u32(data);
			break;
		case MP_HINT_EXT_8:
			/* MP_EXT (8) */
			MP_CHECK_LEN(sizeof(uint8_t) + sizeof(uint8_t));
			len = mp_load_u8(data);
			mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_EXT_16:
			/* MP_EXT (16) */
			MP_CHECK_LEN(sizeof(uint16_t) + sizeof(uint8_t));
			len = mp_load_u16(data);
			mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_EXT_32:
			/* MP_EXT (32) */
			MP_CHECK_LEN(sizeof(uint32_t) + sizeof(uint8_t));
			len = mp_load_u32(data);
			mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		default:
			mp_unreachable();
		}
	}

	assert(*data <= end);
#undef MP_CHECK_LEN
	return 0;
}